

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void Js::CompoundString::AppendGeneric<Js::CompoundString>
               (char16 *s,CharCount appendCharLength,CompoundString *toString,bool appendChars)

{
  char16 c;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  JavascriptString *s_00;
  char16_t *pcVar5;
  char16_t *pcVar6;
  
  if (s == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b4,"(s)","s");
    if (!bVar2) goto LAB_00aa5edb;
    *puVar3 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b5,"(toString)","toString");
    if (!bVar2) goto LAB_00aa5edb;
    *puVar3 = 0;
  }
  pcVar4 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar4 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b6,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00aa5edb;
    *puVar3 = 0;
  }
  bVar2 = OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b7,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00aa5edb;
    *puVar3 = 0;
  }
  if ((appendChars) && (bVar2 = HasOnlyDirectChars(toString), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b8,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
LAB_00aa5edb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (appendCharLength != 0) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
    if (bVar2) {
      pcVar5 = L"";
      if (8 < appendCharLength) {
        pcVar5 = L"...";
      }
      pcVar6 = L"false";
      if (appendChars) {
        pcVar6 = L"true";
      }
      Output::Print(L"CompoundString::AppendGeneric(char16 *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                    ,s,pcVar5,(ulong)appendCharLength,pcVar6);
      Output::Flush();
    }
    if ((!appendChars) && (bVar2 = HasOnlyDirectChars(toString), !bVar2)) {
      s_00 = JavascriptString::NewCopyBuffer
                       (s,appendCharLength,
                        (((((toString->super_LiteralString).super_JavascriptString.
                            super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
      bVar2 = TryAppendGeneric<Js::CompoundString>(s_00,appendCharLength,toString);
      if (bVar2) {
        return;
      }
      AppendSlow(toString,s_00);
      return;
    }
    if (appendCharLength == 1) {
      c = *s;
      bVar2 = TryAppendGeneric<Js::CompoundString>(c,toString);
      if (!bVar2) {
        AppendSlow(toString,c);
        return;
      }
    }
    else {
      bVar2 = TryAppendGeneric<Js::CompoundString>(s,appendCharLength,toString);
      if (!bVar2) {
        AppendSlow(toString,s,appendCharLength);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(char16 *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s,
                appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = s[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            // Skip the check for Block::ShouldAppendChars because the string buffer has to be copied anyway
            if(TryAppendGeneric(s, appendCharLength, toString))
                return;
            toString->AppendSlow(s, appendCharLength);
            return;
        }

        JavascriptString *const js = JavascriptString::NewCopyBuffer(s, appendCharLength, toString->GetScriptContext());
        if(TryAppendGeneric(js, appendCharLength, toString))
            return;
        toString->AppendSlow(js);
    }